

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O3

Vec_Wrd_t * Bdc_SpfdReadFiles6(Vec_Int_t **pvWeights)

{
  Vec_Wrd_t *pVVar1;
  word *__ptr;
  FILE *pFVar2;
  Vec_Int_t *pVVar3;
  int *__ptr_00;
  
  pVVar1 = (Vec_Wrd_t *)malloc(0x10);
  pVVar1->nCap = 0xc2f537;
  __ptr = (word *)calloc(1,0x617a9b8);
  pVVar1->pArray = __ptr;
  pVVar1->nSize = 0xc2f537;
  pFVar2 = fopen("func6v6n_bin.txt","rb");
  fread(__ptr,8,0xc2f537,pFVar2);
  fclose(pFVar2);
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  pVVar3->nCap = 0xc2f537;
  __ptr_00 = (int *)calloc(1,0x30bd4dc);
  pVVar3->pArray = __ptr_00;
  pVVar3->nSize = 0xc2f537;
  pFVar2 = fopen("func6v6nW_bin.txt","rb");
  fread(__ptr_00,4,0xc2f537,pFVar2);
  fclose(pFVar2);
  *pvWeights = pVVar3;
  return pVVar1;
}

Assistant:

Vec_Wrd_t * Bdc_SpfdReadFiles6( Vec_Int_t ** pvWeights )
{
    Vec_Int_t * vWeights;
    Vec_Wrd_t * vDivs = Vec_WrdStart( 12776759 );
    FILE * pFile = fopen( "func6v6n_bin.txt", "rb" );
    int RetValue;
    RetValue = fread( Vec_WrdArray(vDivs), sizeof(word), Vec_WrdSize(vDivs), pFile );
    fclose( pFile );

    vWeights = Vec_IntStart( 12776759 );
    pFile = fopen( "func6v6nW_bin.txt", "rb" );
    RetValue = fread( Vec_IntArray(vWeights), sizeof(int), Vec_IntSize(vWeights), pFile );
    fclose( pFile );

    *pvWeights = vWeights;
    return vDivs;
}